

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O3

DefinesPartition * __thiscall
VulkanHppGenerator::partitionDefines
          (DefinesPartition *__return_storage_ptr__,VulkanHppGenerator *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::DefineData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::DefineData>_>_>
          *defines)

{
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::DefineData>
  *__v;
  bool bVar1;
  int iVar2;
  _Base_ptr p_Var3;
  const_iterator cVar4;
  long *plVar5;
  long lVar6;
  DefinesPartition *this_00;
  _Rb_tree_header *p_Var7;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ignoredDefines;
  allocator_type local_da;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_d9;
  DefinesPartition *local_d8;
  DefinesPartition *local_d0;
  DefinesPartition *local_c8;
  undefined1 local_c0 [32];
  undefined1 *local_a0 [2];
  undefined1 local_90 [16];
  long *local_80 [2];
  long local_70 [2];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  p_Var7 = &(__return_storage_ptr__->callees)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->callees)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  *(undefined8 *)&(__return_storage_ptr__->callees)._M_t._M_impl = 0;
  *(undefined8 *)&(__return_storage_ptr__->callees)._M_t._M_impl.super__Rb_tree_header._M_header = 0
  ;
  (__return_storage_ptr__->callees)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var7->_M_header;
  (__return_storage_ptr__->callees)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var7->_M_header;
  p_Var7 = &(__return_storage_ptr__->callers)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->callees)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(__return_storage_ptr__->callers)._M_t._M_impl = 0;
  *(undefined8 *)&(__return_storage_ptr__->callers)._M_t._M_impl.super__Rb_tree_header._M_header = 0
  ;
  (__return_storage_ptr__->callers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->callers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var7->_M_header;
  (__return_storage_ptr__->callers)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var7->_M_header;
  p_Var7 = &(__return_storage_ptr__->values)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->callers)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(__return_storage_ptr__->values)._M_t._M_impl = 0;
  *(undefined8 *)&(__return_storage_ptr__->values)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (__return_storage_ptr__->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var7->_M_header;
  (__return_storage_ptr__->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var7->_M_header;
  (__return_storage_ptr__->values)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var3 = (defines->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var7 = &(defines->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 != p_Var7) {
    local_c8 = (DefinesPartition *)&__return_storage_ptr__->callers;
    local_d0 = (DefinesPartition *)&__return_storage_ptr__->values;
    local_d8 = __return_storage_ptr__;
    do {
      local_c0._8_8_ = *(undefined8 *)(p_Var3 + 1);
      local_c0._0_8_ = p_Var3[1]._M_parent;
      bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::starts_with
                        ((basic_string_view<char,_std::char_traits<char>_> *)local_c0,"VK_");
      if (bVar1) {
        __v = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::DefineData>
               *)(p_Var3 + 1);
        iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__v,
                        "VK_DEFINE_HANDLE");
        if (iVar2 != 0) {
          if (p_Var3[4]._M_right == (_Base_ptr)0x0) {
            if (p_Var3[6]._M_left == (_Base_ptr)0x0) {
              local_c0._0_8_ = local_c0 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_c0,"VK_DEFINE_NON_DISPATCHABLE_HANDLE","");
              local_a0[0] = local_90;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_a0,"VK_NULL_HANDLE","");
              local_80[0] = local_70;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_80,"VK_USE_64_BIT_PTR_DEFINES","");
              __l._M_len = 3;
              __l._M_array = (iterator)local_c0;
              std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(local_70 + 2),__l,&local_d9,&local_da);
              lVar6 = -0x60;
              plVar5 = local_70;
              do {
                if (plVar5 != (long *)plVar5[-2]) {
                  operator_delete((long *)plVar5[-2],*plVar5 + 1);
                }
                plVar5 = plVar5 + -4;
                lVar6 = lVar6 + 0x20;
              } while (lVar6 != 0);
              cVar4 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)(local_70 + 2),(key_type *)__v);
              __return_storage_ptr__ = local_d8;
              if ((_Rb_tree_header *)cVar4._M_node == &local_60._M_impl.super__Rb_tree_header) {
                __assert_fail("ignoredDefines.contains( define.first )",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                              ,0x3ddd,
                              "VulkanHppGenerator::DefinesPartition VulkanHppGenerator::partitionDefines(const std::map<std::string, DefineData> &)"
                             );
              }
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)(local_70 + 2));
              goto LAB_0010c6d6;
            }
            this_00 = __return_storage_ptr__;
            if (p_Var3[5]._M_left == p_Var3[5]._M_right) {
              this_00 = local_d0;
            }
          }
          else if ((p_Var3[5]._M_left == p_Var3[5]._M_right) ||
                  (this_00 = local_c8, p_Var3[6]._M_left != (_Base_ptr)0x0)) {
            __assert_fail("!define.second.params.empty() && define.second.possibleDefinition.empty()"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                          ,0x3ded,
                          "VulkanHppGenerator::DefinesPartition VulkanHppGenerator::partitionDefines(const std::map<std::string, DefineData> &)"
                         );
          }
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,VulkanHppGenerator::DefineData>,std::_Select1st<std::pair<std::__cxx11::string_const,VulkanHppGenerator::DefineData>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,VulkanHppGenerator::DefineData>>>
          ::
          _M_insert_unique<std::pair<std::__cxx11::string_const,VulkanHppGenerator::DefineData>const&>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,VulkanHppGenerator::DefineData>,std::_Select1st<std::pair<std::__cxx11::string_const,VulkanHppGenerator::DefineData>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,VulkanHppGenerator::DefineData>>>
                      *)this_00,__v);
        }
      }
LAB_0010c6d6:
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var7);
  }
  return __return_storage_ptr__;
}

Assistant:

VulkanHppGenerator::DefinesPartition VulkanHppGenerator::partitionDefines( std::map<std::string, DefineData> const & defines )
{
  DefinesPartition partition{};
  for ( auto const & define : defines )
  {
    // VK_DEFINE_HANDLE is macro magic that cannot be constexpr-ed
    // Also filter out the VKSC_ macros, as although they are in the spec, they are not defined in any header.
    if ( define.first.starts_with( "VK_" ) && ( define.first != "VK_DEFINE_HANDLE" ) )
    {
      if ( define.second.possibleCallee.empty() )
      {
        if ( define.second.possibleDefinition.empty() )
        {
#if !defined( NDEBUG )
          const std::set<std::string> ignoredDefines{ "VK_DEFINE_NON_DISPATCHABLE_HANDLE", "VK_NULL_HANDLE", "VK_USE_64_BIT_PTR_DEFINES" };
#endif
          assert( ignoredDefines.contains( define.first ) );
        }
        else
        {
          if ( define.second.params.empty() )
          {
            partition.values.insert( define );
          }
          else
          {
            partition.callees.insert( define );
          }
        }
      }
      else
      {
        assert( !define.second.params.empty() && define.second.possibleDefinition.empty() );
        partition.callers.insert( define );
      }
    }
  }
  return partition;
}